

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lys_compile_unres_depset(ly_ctx *ctx,lys_glob_unres *unres)

{
  lyxp_set_scnode *plVar1;
  lysc_type_bitenum_item *item;
  ushort uVar2;
  uint32_t uVar3;
  lyd_node *plVar4;
  lyplg_type *plVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  long lVar8;
  lysc_node *plVar9;
  lyd_node_inner *plVar10;
  bool bVar11;
  undefined1 *puVar12;
  lysf_ctx *ctx_00;
  ly_bool lVar13;
  LY_ERR LVar14;
  uint uVar15;
  uint32_t uVar16;
  int iVar17;
  LY_ERR LVar18;
  lysc_type_leafref *plVar19;
  lysc_must *plVar20;
  lysc_ext_instance *plVar21;
  lysc_type *plVar22;
  lys_module *plVar23;
  lysc_when **pplVar24;
  lysc_must *plVar25;
  lysc_node *plVar26;
  long lVar27;
  long *plVar28;
  void *pvVar29;
  lyd_value *storage;
  undefined8 uVar30;
  ushort uVar31;
  uint uVar32;
  ulong uVar33;
  lysc_when *plVar34;
  char *format;
  ushort uVar35;
  LY_VECODE code;
  ulong uVar36;
  lysc_when *plVar37;
  uint64_t u;
  ulong uVar38;
  lysc_ext_instance *plVar39;
  uint32_t *puVar40;
  lysp_module **pplVar41;
  size_t __size;
  ly_ctx *plVar42;
  char *pcVar43;
  ly_ht *plVar44;
  ulong uVar45;
  lysc_node *plVar46;
  lysc_type **pplVar47;
  lys_depset_unres *ds_unres;
  uint64_t v;
  ly_path *path;
  lysc_ctx cctx;
  uint local_1278;
  lysc_node *local_1270;
  void *local_1268;
  uint64_t local_1248;
  ulong local_1240;
  lysc_node *local_1238;
  ly_ctx *local_1230;
  lysf_ctx *local_1228;
  uint local_121c;
  ly_set *local_1218;
  ly_set *local_1210;
  ly_set *local_1208;
  ly_set *local_1200;
  lyxp_set local_11f8;
  lyxp_set local_1168;
  lysc_ctx local_10d0;
  
  memset(&local_10d0,0,0x10a0);
  local_1218 = &(unres->ds_unres).musts;
  local_1208 = &(unres->ds_unres).disabled_leafrefs;
  local_1228 = &local_10d0.free_ctx;
  local_1200 = &(unres->ds_unres).disabled_bitenums;
  local_1210 = &(unres->ds_unres).dflts;
  local_1240 = 0;
LAB_001420f2:
  uVar32 = (unres->ds_unres).disabled_leafrefs.count;
  uVar33 = 0;
  uVar36 = 0;
  uVar38 = 0;
  uVar45 = 0;
  do {
    if ((uint)uVar33 < uVar32) {
      uVar33 = uVar33 & 0xffffffff;
      do {
        plVar4 = (unres->ds_unres).disabled_leafrefs.field_2.dnodes[uVar33];
        local_11f8._0_8_ = (lysc_ext_instance *)0x0;
        while (plVar19 = lys_type_leafref_next(*(lysc_node **)plVar4,(uint64_t *)&local_11f8),
              plVar19 != (lysc_type_leafref *)0x0) {
          LVar14 = lys_compile_expr_implement
                             (ctx,plVar19->path,LY_VALUE_SCHEMA_RESOLVED,plVar19->prefixes,'\x01',
                              unres,(lys_module **)0x0);
          if (LVar14 != LY_SUCCESS) goto LAB_0014373c;
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 < (unres->ds_unres).disabled_leafrefs.count);
    }
    if ((uint)uVar36 < (unres->ds_unres).leafrefs.count) {
      uVar36 = uVar36 & 0xffffffff;
      do {
        plVar4 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar36];
        local_11f8._0_8_ = (lysc_ext_instance *)0x0;
        while (plVar19 = lys_type_leafref_next(*(lysc_node **)plVar4,(uint64_t *)&local_11f8),
              plVar19 != (lysc_type_leafref *)0x0) {
          LVar14 = lys_compile_expr_implement
                             (ctx,plVar19->path,LY_VALUE_SCHEMA_RESOLVED,plVar19->prefixes,'\x01',
                              unres,(lys_module **)0x0);
          if (LVar14 != LY_SUCCESS) goto LAB_0014373c;
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 < (unres->ds_unres).leafrefs.count);
    }
    if ((uint)uVar38 < (unres->ds_unres).whens.count) {
      uVar38 = uVar38 & 0xffffffff;
      do {
        while( true ) {
          plVar4 = (unres->ds_unres).whens.field_2.dnodes[uVar38];
          plVar46 = plVar4->schema;
          LVar14 = lys_compile_expr_implement
                             (ctx,*(lyxp_expr **)plVar46,LY_VALUE_SCHEMA_RESOLVED,plVar46->parent,
                              (byte)ctx->flags & 2,unres,(lys_module **)&local_1168);
          if (LVar14 != LY_SUCCESS) goto LAB_0014373c;
          if ((lys_module *)local_1168._0_8_ == (lys_module *)0x0) break;
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                 "When condition \"%s\" check skipped because referenced module \"%s\" is not implemented."
                 ,*(undefined8 *)(*(long *)plVar4->schema + 0x28),
                 *(lysc_ext_instance **)(local_1168._0_8_ + 8));
          ly_set_rm_index(&(unres->ds_unres).whens,(uint32_t)uVar38,free);
          if ((unres->ds_unres).whens.count <= uVar38) goto LAB_00142310;
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 < (unres->ds_unres).whens.count);
    }
LAB_00142310:
    plVar39 = (lysc_ext_instance *)local_11f8._0_8_;
    if ((uint)uVar45 < (unres->ds_unres).musts.count) {
      uVar45 = uVar45 & 0xffffffff;
      do {
        while( true ) {
          local_1238 = (lysc_node *)(unres->ds_unres).musts.field_2.dnodes[uVar45];
          plVar20 = lysc_node_musts(*(lysc_node **)local_1238);
          plVar39 = (lysc_ext_instance *)0x0;
          bVar11 = false;
          plVar25 = plVar20;
          while( true ) {
            if (plVar20 == (lysc_must *)0x0) {
              plVar21 = (lysc_ext_instance *)0x0;
            }
            else {
              plVar21 = plVar20[-1].exts;
            }
            if (plVar21 <= plVar39) break;
            LVar14 = lys_compile_expr_implement
                               (ctx,plVar25->cond,LY_VALUE_SCHEMA_RESOLVED,plVar25->prefixes,
                                (byte)ctx->flags & 2,unres,(lys_module **)&local_1168);
            if (LVar14 != LY_SUCCESS) goto LAB_0014373c;
            if ((lys_module *)local_1168._0_8_ != (lys_module *)0x0) {
              ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                     "Must condition \"%s\" check skipped because referenced module \"%s\" is not implemented."
                    );
              bVar11 = true;
            }
            plVar39 = (lysc_ext_instance *)((long)&plVar39->def + 1);
            plVar25 = plVar25 + 1;
          }
          if (!bVar11) break;
          lysc_unres_must_free((lysc_unres_must *)local_1238);
          ly_set_rm_index(local_1218,(uint32_t)uVar45,(_func_void_void_ptr *)0x0);
          if ((unres->ds_unres).musts.count <= uVar45) goto LAB_00142446;
        }
        uVar45 = uVar45 + 1;
      } while (uVar45 < (unres->ds_unres).musts.count);
    }
LAB_00142446:
    uVar32 = (unres->ds_unres).disabled_leafrefs.count;
    local_11f8._0_8_ = plVar39;
  } while ((((uint)uVar33 < uVar32) ||
           (uVar15 = (unres->ds_unres).leafrefs.count, (uint)uVar36 < uVar15)) ||
          ((uint)uVar38 < (unres->ds_unres).whens.count));
  if (uVar32 != 0) {
    do {
      plVar4 = (unres->ds_unres).disabled_leafrefs.field_2.dnodes[uVar32 - 1];
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)plVar4->parent;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = (*(lysc_node **)plVar4)->module->parsed->mod->ctx;
      ly_log_location(*(lysc_node **)plVar4,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      local_1248 = 0;
      while (plVar19 = lys_type_leafref_next(*(lysc_node **)plVar4,&local_1248),
            plVar19 != (lysc_type_leafref *)0x0) {
        LVar14 = lys_compile_unres_leafref
                           (&local_10d0,*(lysc_node **)plVar4,plVar19,(lysp_module *)plVar4->schema)
        ;
        if (LVar14 != LY_SUCCESS) goto LAB_00143762;
      }
      ly_log_location_revert(1,0,0,0);
      ly_set_rm_index(local_1208,uVar32 - 1,free);
      uVar32 = (unres->ds_unres).disabled_leafrefs.count;
    } while (uVar32 != 0);
    uVar15 = (unres->ds_unres).leafrefs.count;
  }
  uVar32 = (uint)local_1240;
  if (uVar32 < uVar15) {
    uVar33 = local_1240 & 0xffffffff;
    do {
      plVar4 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar33];
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)plVar4->parent;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = (*(lysc_node **)plVar4)->module->parsed->mod->ctx;
      ly_log_location(*(lysc_node **)plVar4,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      local_1248 = 0;
      while (plVar19 = lys_type_leafref_next(*(lysc_node **)plVar4,&local_1248),
            plVar19 != (lysc_type_leafref *)0x0) {
        LVar14 = lys_compile_unres_leafref
                           (&local_10d0,*(lysc_node **)plVar4,plVar19,(lysp_module *)plVar4->schema)
        ;
        if (LVar14 != LY_SUCCESS) goto LAB_00143762;
      }
      ly_log_location_revert(1,0,0,0);
      uVar33 = uVar33 + 1;
      uVar15 = (unres->ds_unres).leafrefs.count;
    } while (uVar33 < uVar15);
    uVar32 = (uint)local_1240;
  }
  uVar33 = local_1240;
  local_1230 = ctx;
  if (uVar32 < uVar15) {
    uVar33 = (ulong)uVar32;
    do {
      plVar4 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar33];
      local_1248 = 0;
      plVar19 = lys_type_leafref_next(*(lysc_node **)plVar4,&local_1248);
      while (plVar19 != (lysc_type_leafref *)0x0) {
        pplVar47 = &plVar19->realtype;
        plVar22 = (lysc_type *)pplVar47;
        do {
          plVar5 = *(lyplg_type **)plVar22;
          plVar22 = (lysc_type *)&plVar5->duplicate;
        } while (*(LY_DATA_TYPE *)&plVar5->compare == LY_TYPE_LEAFREF);
        lysc_type_free(local_1228,*pplVar47);
        *pplVar47 = (lysc_type *)plVar5;
        puVar12 = (undefined1 *)((long)&plVar5->compare + 4);
        *(int *)puVar12 = *(int *)puVar12 + 1;
        plVar19 = lys_type_leafref_next(*(lysc_node **)plVar4,&local_1248);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < (unres->ds_unres).leafrefs.count);
  }
  local_1240 = uVar33;
  uVar3 = (unres->ds_unres).whens.count;
  while (uVar3 != 0) {
    plVar4 = (unres->ds_unres).whens.field_2.dnodes[uVar3 - 1];
    local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
    local_10d0.cur_mod = (local_10d0.pmod)->mod;
    local_10d0.ctx = (local_10d0.cur_mod)->ctx;
    local_10d0.ext = (lysc_ext_instance *)0x0;
    local_10d0.path_len = 1;
    local_10d0.path[0] = '/';
    local_10d0.free_ctx.ctx = (*(lysc_node **)plVar4)->module->parsed->mod->ctx;
    ly_log_location(*(lysc_node **)plVar4,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    plVar6 = *(lys_module **)plVar4;
    plVar46 = plVar4->schema;
    memset(&local_11f8,0,0x90);
    LVar14 = lyxp_atomize(local_10d0.ctx,*(lyxp_expr **)plVar46,(lys_module *)plVar6->name,
                          LY_VALUE_SCHEMA_RESOLVED,plVar46->parent,(lysc_node *)plVar46->module,
                          (lysc_node *)plVar46->module,&local_11f8,
                          *(uint16_t *)((long)&plVar6->ctx + 2) >> 9 & 0x10 | 8);
    if (LVar14 == LY_SUCCESS) {
      local_10d0.path[0] = '\0';
      uVar33 = 0;
      lysc_path((lysc_node *)plVar6,LYSC_PATH_LOG,local_10d0.path,0xfee);
      if (local_11f8.used != 0) {
        lVar27 = 0xc;
        uVar36 = 0;
        do {
          if ((*(int *)((long)local_11f8.val.nodes + lVar27 + -4) == 3) &&
             (*(int *)((long)&(local_11f8.val.nodes)->node + lVar27) != -1)) {
            plVar7 = *(lys_module **)((long)local_11f8.val.nodes + lVar27 + -0xc);
            uVar35 = *(ushort *)((long)&plVar46->dsc + 4);
            uVar2 = *(uint16_t *)((long)&plVar7->ctx + 2);
            uVar31 = uVar35 & 0x1c;
            if ((uVar35 & 0x1c) == 0) {
              uVar31 = 4;
            }
            uVar35 = uVar2 & 0x1c;
            if ((uVar2 & 0x1c) == 0) {
              uVar35 = 4;
            }
            if (((lys_module *)plVar6->name == (lys_module *)plVar7->name) && (uVar31 < uVar35)) {
              pcVar43 = "deprecated";
              if (uVar2 == 0x10) {
                pcVar43 = "obsolete";
              }
              ly_log(local_10d0.ctx,LY_LLWRN,LY_SUCCESS,
                     "When condition \"%s\" may be referencing %s node \"%s\".",
                     *(undefined8 *)(*(long *)plVar46 + 0x28),pcVar43,plVar7->filepath);
            }
            plVar23 = (lys_module *)lysc_data_node((lysc_node *)plVar7->revision);
            if (plVar23 == plVar6) {
              pcVar43 = "When condition is accessing its own conditional node children.";
            }
            else {
              if ((plVar7 != plVar6) ||
                 (*(int *)((long)&(local_11f8.val.nodes)->node + lVar27) != 1)) goto LAB_001428f0;
              pcVar43 = "When condition is accessing its own conditional node value.";
            }
            ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,pcVar43);
            LVar14 = LY_EVALID;
            goto LAB_00142cab;
          }
LAB_001428f0:
          uVar36 = uVar36 + 1;
          uVar33 = (ulong)local_11f8.used;
          lVar27 = lVar27 + 0x18;
        } while (uVar36 < uVar33);
      }
      if (plVar46->module != plVar6) {
        if ((lys_module *)(local_11f8.val.nodes)->node != plVar46->module) {
          __assert_fail("tmp_set.val.scnodes[0].scnode == when->context",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                        ,0x2a4,
                        "LY_ERR lys_compile_unres_when(struct lysc_ctx *, const struct lysc_when *, const struct lysc_node *)"
                       );
        }
        if ((local_11f8.val.nodes)->pos == 0xffffffff) {
          (local_11f8.val.scnodes)->scnode = (lysc_node *)plVar6;
        }
        else {
          LVar14 = lyxp_set_scnode_insert_node
                             (&local_11f8,(lysc_node *)plVar6,~LYXP_NODE_NONE,LYXP_AXIS_CHILD,
                              (uint32_t *)0x0);
          if (LVar14 != LY_SUCCESS) goto LAB_00142cab;
          uVar33 = (ulong)local_11f8.used;
        }
      }
      LVar14 = LY_SUCCESS;
      memset(&local_1168,0,0x90);
      if ((int)uVar33 != 0) {
        lVar27 = 0;
        do {
          if (*(int *)((long)&(local_11f8.val.nodes)->pos + lVar27) != -1) {
            *(undefined4 *)((long)&(local_11f8.val.nodes)->pos + lVar27) = 2;
          }
          lVar27 = lVar27 + 0x18;
        } while (uVar33 * 0x18 != lVar27);
        uVar36 = 0;
        do {
          if (*(int *)((long)local_11f8.val.nodes + uVar36 * 0x18 + 0xc) == 2) {
            plVar1 = local_11f8.val.scnodes + uVar36 * 0x18;
            puVar40 = (uint32_t *)((long)local_11f8.val.nodes + uVar36 * 0x18 + 0xc);
            if ((plVar1->type == LYXP_NODE_ELEM) &&
               (local_1238 = (lysc_node *)(uVar36 * 3), pplVar24 = lysc_node_when(plVar1->scnode),
               pplVar24 != (lysc_when **)0x0)) {
              plVar46 = plVar1->scnode;
              do {
                ly_log_location(plVar46,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
                pplVar24 = lysc_node_when(plVar46);
                plVar37 = (lysc_when *)0x0;
                while( true ) {
                  if (pplVar24 == (lysc_when **)0x0) {
                    plVar34 = (lysc_when *)0x0;
                  }
                  else {
                    plVar34 = pplVar24[-1];
                  }
                  if (plVar34 <= plVar37) break;
                  plVar34 = pplVar24[(long)plVar37];
                  LVar18 = lyxp_atomize(local_11f8.ctx,plVar34->cond,plVar46->module,
                                        LY_VALUE_SCHEMA_RESOLVED,plVar34->prefixes,plVar34->context,
                                        plVar34->context,&local_1168,8);
                  if (LVar18 != LY_SUCCESS) {
                    ly_vlog(local_11f8.ctx,(char *)0x0,LYVE_SEMANTICS,
                            "Invalid when condition \"%s\".",plVar34->cond->expr);
LAB_00142c16:
                    LVar14 = LVar18;
                    ly_log_location_revert(1,0,0,0);
                    goto LAB_00142c30;
                  }
                  if (local_1168.used != 0) {
                    lVar27 = 0;
                    uVar33 = 0;
                    uVar16 = local_1168.used;
                    do {
                      if (*(int *)((long)&(local_1168.val.nodes)->type + lVar27) == 3) {
                        lVar13 = lyxp_set_scnode_contains
                                           (&local_11f8,
                                            *(lysc_node **)
                                             ((long)&(local_1168.val.nodes)->node + lVar27),
                                            LYXP_NODE_ELEM,-1,&local_121c);
                        if ((lVar13 != '\0') &&
                           (*(int *)((long)local_11f8.val.nodes + (ulong)local_121c * 0x18 + 0xc) ==
                            -1)) {
                          ly_vlog(local_11f8.ctx,(char *)0x0,LYVE_SEMANTICS,
                                  "When condition cyclic dependency on the node \"%s\".",
                                  *(undefined8 *)
                                   (*(long *)((long)&(local_1168.val.nodes)->node + lVar27) + 0x28))
                          ;
                          LVar18 = LY_EVALID;
                          goto LAB_00142c16;
                        }
                        *(undefined4 *)((long)&(local_1168.val.nodes)->pos + lVar27) = 2;
                        uVar16 = local_1168.used;
                      }
                      else {
                        *(undefined4 *)((long)&(local_1168.val.nodes)->pos + lVar27) = 0;
                      }
                      uVar33 = uVar33 + 1;
                      lVar27 = lVar27 + 0x18;
                    } while (uVar33 < uVar16);
                  }
                  if (plVar34->context != plVar46) {
                    if ((lysc_node *)(local_1168.val.nodes)->node != plVar34->context) {
                      __assert_fail("tmp_set.val.scnodes[0].scnode == when->context",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                                    ,0x236,
                                    "LY_ERR lys_compile_unres_when_cyclic(struct lyxp_set *, const struct lysc_node *)"
                                   );
                    }
                    if ((local_1168.val.nodes)->pos == 0xffffffff) {
                      (local_1168.val.scnodes)->scnode = plVar46;
                    }
                    else {
                      LVar18 = lyxp_set_scnode_insert_node
                                         (&local_1168,plVar46,~LYXP_NODE_NONE,LYXP_AXIS_CHILD,
                                          (uint32_t *)0x0);
                      if (LVar18 != LY_SUCCESS) goto LAB_00142c16;
                    }
                  }
                  lyxp_set_scnode_merge(&local_11f8,&local_1168);
                  plVar37 = (lysc_when *)((long)&plVar37->cond + 1);
                }
                ly_log_location_revert(1,0,0,0);
                plVar46 = plVar46->parent;
              } while ((plVar46 != (lysc_node *)0x0) && ((plVar46->nodetype & 0x82) != 0));
              puVar40 = &(local_11f8.val.nodes)->pos + (long)local_1238 * 2;
            }
            *puVar40 = 0;
            uVar33 = (ulong)local_11f8.used;
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 < uVar33);
      }
LAB_00142c30:
      lyxp_set_free_content(&local_1168);
    }
    else {
      ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid when condition \"%s\".",
              *(undefined8 *)(*(long *)plVar46 + 0x28));
    }
LAB_00142cab:
    lyxp_set_free_content(&local_11f8);
    ly_log_location_revert(1,0,0,0);
    if (LVar14 != LY_SUCCESS) goto LAB_0014373c;
    free(plVar4);
    ly_set_rm_index(&(unres->ds_unres).whens,uVar3 - 1,(_func_void_void_ptr *)0x0);
    uVar3 = (unres->ds_unres).whens.count;
  }
  while (uVar3 = (unres->ds_unres).musts.count, uVar3 != 0) {
    uVar32 = uVar3 - 1;
    plVar4 = (unres->ds_unres).musts.field_2.dnodes[uVar32];
    local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
    local_10d0.cur_mod = (local_10d0.pmod)->mod;
    local_10d0.ctx = (local_10d0.cur_mod)->ctx;
    local_10d0.ext = (lysc_ext_instance *)plVar4->parent;
    local_10d0.path_len = 1;
    local_10d0.path[0] = '/';
    local_10d0.free_ctx.ctx = (*(lysc_node **)plVar4)->module->parsed->mod->ctx;
    ly_log_location(*(lysc_node **)plVar4,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    plVar46 = *(lysc_node **)plVar4;
    plVar9 = plVar4->schema;
    ly_log_location(plVar46,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    memset(&local_1168,0,0x90);
    local_1278 = plVar46->flags >> 9 & 0x10 | 8;
    plVar25 = lysc_node_musts(plVar46);
    plVar39 = (lysc_ext_instance *)0x0;
    while( true ) {
      if (plVar25 == (lysc_must *)0x0) {
        plVar21 = (lysc_ext_instance *)0x0;
      }
      else {
        plVar21 = plVar25[-1].exts;
      }
      if (plVar21 <= plVar39) {
        LVar14 = LY_SUCCESS;
        goto LAB_00142f52;
      }
      LVar14 = lyxp_atomize(local_10d0.ctx,plVar25[(long)plVar39].cond,plVar46->module,
                            LY_VALUE_SCHEMA_RESOLVED,plVar25[(long)plVar39].prefixes,plVar46,plVar46
                            ,&local_1168,local_1278);
      if (LVar14 != LY_SUCCESS) break;
      local_10d0.path[0] = '\0';
      lysc_path(plVar46,LYSC_PATH_LOG,local_10d0.path,0xfee);
      if ((ulong)local_1168.used != 0) {
        lVar27 = 0;
        do {
          if (*(int *)((long)&(local_1168.val.nodes)->type + lVar27) == 3) {
            plVar6 = (lys_module *)**(undefined8 **)(plVar9->hash + (long)plVar39 * 8 + -4);
            uVar35 = 4;
            if ((plVar6 == plVar46->module) &&
               (uVar35 = plVar46->flags & 0x1c, (plVar46->flags & 0x1c) == 0)) {
              uVar35 = 4;
            }
            lVar8 = *(long *)((long)&(local_1168.val.nodes)->node + lVar27);
            uVar2 = *(ushort *)(lVar8 + 2);
            uVar31 = uVar2 & 0x1c;
            if ((uVar2 & 0x1c) == 0) {
              uVar31 = 4;
            }
            if ((plVar6 == *(lys_module **)(lVar8 + 8)) && (uVar35 < uVar31)) {
              pcVar43 = "deprecated";
              if (uVar2 == 0x10) {
                pcVar43 = "obsolete";
              }
              ly_log(local_10d0.ctx,LY_LLWRN,LY_SUCCESS,
                     "Must condition \"%s\" may be referencing %s node \"%s\".",
                     (plVar25[(long)plVar39].cond)->expr,pcVar43,*(undefined8 *)(lVar8 + 0x28));
              break;
            }
          }
          lVar27 = lVar27 + 0x18;
        } while ((ulong)local_1168.used * 0x18 != lVar27);
      }
      lyxp_set_free_content(&local_1168);
      plVar39 = (lysc_ext_instance *)((long)&plVar39->def + 1);
    }
    ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid must condition \"%s\".",
            (plVar25[(long)plVar39].cond)->expr);
LAB_00142f52:
    lyxp_set_free_content(&local_1168);
    ly_log_location_revert(1,0,0,0);
    ly_log_location_revert(1,0,0,0);
    if (LVar14 != LY_SUCCESS) goto LAB_0014373c;
    lysc_unres_must_free((lysc_unres_must *)plVar4);
    ly_set_rm_index(local_1218,uVar32,(_func_void_void_ptr *)0x0);
  }
  while (uVar3 = (unres->ds_unres).disabled_bitenums.count, uVar3 != 0) {
    uVar32 = uVar3 - 1;
    plVar46 = (lysc_node *)(unres->ds_unres).disabled_bitenums.field_2.dnodes[uVar32];
    local_10d0.pmod = plVar46->module->parsed;
    local_10d0.cur_mod = (local_10d0.pmod)->mod;
    local_10d0.ctx = (local_10d0.cur_mod)->ctx;
    local_10d0.ext = (lysc_ext_instance *)0x0;
    local_10d0.path_len = 1;
    local_10d0.path[0] = '/';
    local_10d0.free_ctx.ctx = plVar46->module->parsed->mod->ctx;
    ly_log_location(plVar46,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    local_1238 = plVar46;
    if (*(int *)&(plVar46[1].parent)->next == 0xf) {
      local_1270 = (plVar46[1].parent)->prev;
      if ((local_1270 == (lysc_node *)0x0) ||
         (local_1268 = local_1270[-1].priv, local_1268 == (void *)0x0)) {
LAB_00143774:
        pcVar43 = local_1238->name;
        format = "Node \"%s\" without any (or all disabled) valid values.";
        code = LYVE_SEMANTICS;
        plVar42 = local_10d0.ctx;
        goto LAB_00143793;
      }
    }
    else {
      local_1270 = (lysc_node *)&plVar46[1].parent;
      local_1268 = (void *)0x1;
    }
    bVar11 = false;
    pvVar29 = (void *)0x0;
LAB_0014308f:
    do {
      lVar27 = *(long *)(local_1270->hash + (long)pvVar29 * 8 + -4);
      if ((*(int *)(lVar27 + 0x18) == 0xb) || (*(int *)(lVar27 + 0x18) == 7)) {
        lVar8 = *(long *)(lVar27 + 0x20);
        uVar33 = 0;
        do {
          item = (lysc_type_bitenum_item *)(lVar8 + uVar33 * 0x28);
          while( true ) {
            if (lVar8 == 0) {
              uVar36 = 0;
            }
            else {
              uVar36 = *(ulong *)(lVar8 + -8);
            }
            if (uVar36 <= uVar33) {
              if ((*(long *)(lVar27 + 0x20) != 0) && (*(long *)(*(long *)(lVar27 + 0x20) + -8) != 0)
                 ) {
                bVar11 = true;
              }
              pvVar29 = (void *)((long)pvVar29 + 1);
              if (pvVar29 != local_1268) goto LAB_0014308f;
              if (bVar11) goto LAB_0014316e;
              goto LAB_00143774;
            }
            if ((item->flags & 0x100) == 0) break;
            lysc_enum_item_free(local_1228,item);
            uVar36 = *(long *)(lVar8 + -8) - 1;
            if (uVar33 <= uVar36 && uVar36 - uVar33 != 0) {
              memmove(item,(void *)(lVar8 + uVar33 * 0x28 + 0x28),(uVar36 - uVar33) * 0x28);
              uVar36 = *(long *)(lVar8 + -8) - 1;
            }
            *(ulong *)(lVar8 + -8) = uVar36;
          }
          uVar33 = uVar33 + 1;
        } while( true );
      }
      pvVar29 = (void *)((long)pvVar29 + 1);
      bVar11 = true;
    } while (pvVar29 != local_1268);
LAB_0014316e:
    ly_log_location_revert(1,0,0,0);
    ly_set_rm_index(local_1200,uVar32,(_func_void_void_ptr *)0x0);
  }
LAB_00143528:
  ctx_00 = local_1228;
  uVar3 = (unres->ds_unres).dflts.count;
  if (uVar3 == 0) goto code_r0x00143534;
  uVar32 = uVar3 - 1;
  plVar4 = (unres->ds_unres).dflts.field_2.dnodes[uVar32];
  local_10d0.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
  local_10d0.cur_mod = (lys_module *)**(long **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
  local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
  local_10d0.ext = (lysc_ext_instance *)0x0;
  local_10d0.path_len = 1;
  local_10d0.path[0] = '/';
  local_10d0.free_ctx.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
  ly_log_location(*(lysc_node **)plVar4,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  plVar46 = *(lysc_node **)plVar4;
  plVar9 = plVar4->schema;
  if (plVar46->nodetype == 4) {
    if (plVar46[1].prev != (lysc_node *)0x0) {
      __assert_fail("!leaf->dflt",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0x3de,
                    "LY_ERR lys_compile_unres_leaf_dlft(struct lysc_ctx *, struct lysc_node_leaf *, struct lysp_qname *, struct lys_glob_unres *)"
                   );
    }
    if ((plVar46->flags & 0x120) == 0) {
      plVar26 = (lysc_node *)calloc(1,0x28);
      plVar46[1].prev = plVar26;
      if (plVar26 == (lysc_node *)0x0) {
        pcVar43 = "lys_compile_unres_leaf_dlft";
LAB_0014386e:
        LVar14 = LY_EMEM;
        ly_log(local_10d0.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar43);
LAB_00143762:
        ly_log_location_revert(1,0,0,0);
        goto LAB_0014373c;
      }
      LVar14 = lys_compile_unres_dflt
                         (&local_10d0,plVar46,(lysc_type *)plVar46[1].parent,*(char **)plVar9,
                          (lysp_module *)plVar9->module,(lyd_value *)plVar26,unres);
      if (LVar14 != LY_SUCCESS) {
        free(plVar46[1].prev);
        plVar46[1].prev = (lysc_node *)0x0;
        goto LAB_00143762;
      }
    }
  }
  else {
    plVar10 = plVar4->parent;
    if (plVar9 == (lysc_node *)0x0 && plVar10 == (lyd_node_inner *)0x0) {
      __assert_fail("dflt || dflts",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0x404,
                    "LY_ERR lys_compile_unres_llist_dflts(struct lysc_ctx *, struct lysc_node_leaflist *, struct lysp_qname *, struct lysp_qname *, struct lys_glob_unres *)"
                   );
    }
    plVar26 = plVar46[1].prev;
    if (plVar26 == (lysc_node *)0x0) {
      if (plVar10 == (lyd_node_inner *)0x0) {
        __size = 0x10;
      }
      else {
        __size = (long)plVar10[-1].children_ht * 8 + 8;
      }
      plVar28 = (long *)calloc(1,__size);
      if (plVar28 == (long *)0x0) goto LAB_00143821;
      lVar27 = 0;
      local_1270 = (lysc_node *)0x0;
    }
    else {
      if (plVar10 == (lyd_node_inner *)0x0) {
        lVar27 = 8;
      }
      else {
        lVar27 = (long)plVar10[-1].children_ht << 3;
      }
      local_1270 = (lysc_node *)plVar26[-1].priv;
      plVar28 = (long *)realloc(&plVar26[-1].priv,lVar27 + (long)local_1270 * 0x10 + 8);
      if (plVar28 == (long *)0x0) {
LAB_00143821:
        pcVar43 = "lys_compile_unres_llist_dflts";
        goto LAB_0014386e;
      }
      lVar27 = *plVar28;
    }
    plVar26 = (lysc_node *)(plVar28 + 1);
    plVar46[1].prev = plVar26;
    if (plVar10 == (lyd_node_inner *)0x0) {
      memset(plVar28 + lVar27 + 1,0,(long)local_1270 * 8 + 8);
      storage = (lyd_value *)calloc(1,0x28);
      *(lyd_value **)(plVar26->hash + (long)local_1270 * 8 + -4) = storage;
      LVar14 = lys_compile_unres_dflt
                         (&local_10d0,plVar46,(lysc_type *)plVar46[1].parent,*(char **)plVar9,
                          (lysp_module *)plVar9->module,storage,unres);
      plVar26 = plVar46[1].prev;
      if (LVar14 != LY_SUCCESS) {
        pvVar29 = *(void **)(plVar26->hash + (long)local_1270 * 8 + -4);
LAB_00143817:
        free(pvVar29);
        goto LAB_00143762;
      }
      plVar26[-1].priv = (void *)((long)plVar26[-1].priv + 1);
    }
    else {
      plVar44 = plVar10[-1].children_ht;
      memset(plVar28 + lVar27 + 1,0,((long)&plVar44->used + (long)local_1270) * 8);
      if (plVar44 != (ly_ht *)0x0) {
        pplVar41 = (lysp_module **)&(plVar10->field_0).node.schema;
        plVar44 = (ly_ht *)0x0;
        do {
          pvVar29 = calloc(1,0x28);
          *(void **)(plVar26->hash + (long)plVar44 * 8 + (long)local_1270 * 8 + -4) = pvVar29;
          LVar14 = lys_compile_unres_dflt
                             (&local_10d0,plVar46,(lysc_type *)plVar46[1].parent,
                              ((lysp_qname *)(pplVar41 + -1))->str,*pplVar41,
                              *(lyd_value **)
                               ((plVar46[1].prev)->hash +
                               (long)plVar44 * 8 + (long)local_1270 * 8 + -4),unres);
          plVar26 = plVar46[1].prev;
          if (LVar14 != LY_SUCCESS) {
            pvVar29 = *(void **)(plVar26->hash + (long)plVar44 * 8 + (long)local_1270 * 8 + -4);
            goto LAB_00143817;
          }
          plVar26[-1].priv = (void *)((long)plVar26[-1].priv + 1);
          plVar44 = (ly_ht *)((long)&plVar44->used + 1);
          pplVar41 = pplVar41 + 3;
        } while (plVar44 < plVar10[-1].children_ht);
      }
    }
    if ((plVar46->flags & 1) != 0) {
      while( true ) {
        if (plVar26 == (lysc_node *)0x0) {
          pvVar29 = (void *)0x0;
        }
        else {
          pvVar29 = plVar26[-1].priv;
        }
        if (pvVar29 <= local_1270) break;
        if (local_1270 != (lysc_node *)0x0) {
          pvVar29 = (void *)0x0;
          do {
            lVar27 = *(long *)((plVar46[1].prev)->hash + (long)local_1270 * 8 + -4);
            iVar17 = (**(code **)(*(long *)(*(long *)(lVar27 + 8) + 0x10) + 0x18))
                               (local_10d0.ctx,lVar27,
                                *(undefined8 *)((plVar46[1].prev)->hash + (long)pvVar29 * 8 + -4));
            plVar42 = local_10d0.ctx;
            if (iVar17 == 0) {
              lVar27 = *(long *)((plVar46[1].prev)->hash + (long)local_1270 * 8 + -4);
              uVar30 = (**(code **)(*(long *)(*(long *)(lVar27 + 8) + 0x10) + 0x28))
                                 (local_10d0.ctx,lVar27,0,0,0,0);
              ly_vlog(plVar42,(char *)0x0,LYVE_SEMANTICS,
                      "Configuration leaf-list has multiple defaults of the same value \"%s\".",
                      uVar30);
              LVar14 = LY_EVALID;
              goto LAB_00143762;
            }
            pvVar29 = (void *)((long)pvVar29 + 1);
          } while (local_1270 != (lysc_node *)pvVar29);
          plVar26 = plVar46[1].prev;
        }
        local_1270 = (lysc_node *)((long)local_1270 + 1);
      }
    }
  }
  ly_log_location_revert(1,0,0,0);
  lysc_unres_dflt_free(local_1230,(lysc_unres_dflt *)plVar4);
  ly_set_rm_index(local_1210,uVar32,(_func_void_void_ptr *)0x0);
  goto LAB_00143528;
code_r0x00143534:
  ctx = local_1230;
  if (((((uint32_t)local_1240 != (unres->ds_unres).leafrefs.count) ||
       ((unres->ds_unres).disabled_leafrefs.count != 0)) || ((unres->ds_unres).whens.count != 0)) ||
     ((unres->ds_unres).musts.count != 0)) goto LAB_001420f2;
  if ((unres->ds_unres).disabled.count != 0) {
    uVar33 = 0;
    do {
      plVar46 = (lysc_node *)(unres->ds_unres).disabled.field_2.dnodes[uVar33];
      LVar14 = lys_compile_unres_check_disabled(plVar46);
      if (LVar14 != LY_SUCCESS) goto LAB_0014373c;
      local_10d0.pmod = plVar46->module->parsed;
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)0x0;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = plVar46->module->parsed->mod->ctx;
      lysc_node_free(ctx_00,plVar46,'\x01');
      uVar33 = uVar33 + 1;
    } while (uVar33 < (unres->ds_unres).disabled.count);
    local_1240 = (ulong)(unres->ds_unres).leafrefs.count;
  }
  if ((int)local_1240 == 0) {
    LVar14 = LY_SUCCESS;
  }
  else {
    uVar33 = 0;
    LVar14 = LY_SUCCESS;
    do {
      plVar4 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar33];
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar4 + 8) + 0x50);
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)plVar4->parent;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar4 + 8) + 0x50)
      ;
      local_1248 = 0;
      while (plVar19 = lys_type_leafref_next(*(lysc_node **)plVar4,&local_1248),
            plVar19 != (lysc_type_leafref *)0x0) {
        LVar18 = ly_path_compile_leafref
                           (local_10d0.ctx,*(lysc_node **)plVar4,local_10d0.ext,plVar19->path,
                            (((*(lysc_node **)plVar4)->flags >> 0xd & 1) != 0) + 1,0x20,
                            LY_VALUE_SCHEMA_RESOLVED,plVar19->prefixes,(ly_path **)&local_1168);
        ly_path_free((ly_path *)local_1168._0_8_);
        if (LVar18 != LY_SUCCESS) {
          if (LVar18 == LY_ERECOMPILE) {
            __assert_fail("ret != LY_ERECOMPILE",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                          ,0x5b9,
                          "LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)"
                         );
          }
          ly_log_location(*(lysc_node **)plVar4,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
          pcVar43 = *(char **)(*(long *)plVar4 + 0x28);
          format = "Target of leafref \"%s\" cannot be referenced because it is disabled.";
          code = LYVE_REFERENCE;
          plVar42 = local_1230;
LAB_00143793:
          ly_vlog(plVar42,(char *)0x0,code,format,pcVar43);
          ly_log_location_revert(1,0,0,0);
          LVar14 = LY_EVALID;
          goto LAB_0014373c;
        }
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < (unres->ds_unres).leafrefs.count);
  }
LAB_0014373c:
  if (local_10d0.free_ctx.ext_set.count == 0) {
    return LVar14;
  }
  __assert_fail("!cctx.free_ctx.ext_set.count",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                ,0x5c6,"LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)");
}

Assistant:

static LY_ERR
lys_compile_unres_depset(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_node *node;
    struct lysc_type *typeiter;
    struct lysc_type_leafref *lref;
    struct lysc_ctx cctx = {0};
    struct lys_depset_unres *ds_unres = &unres->ds_unres;
    struct ly_path *path;
    LY_ARRAY_COUNT_TYPE v;
    struct lysc_unres_leafref *l;
    struct lysc_unres_when *w;
    struct lysc_unres_must *m;
    struct lysc_unres_dflt *d;
    uint32_t i, processed_leafrefs = 0;

resolve_all:
    /* implement all referenced modules to get final ds_unres set */
    if ((ret = lys_compile_unres_depset_implement(ctx, unres))) {
        goto cleanup;
    }

    /* check disabled leafrefs */
    while (ds_unres->disabled_leafrefs.count) {
        /* remember index, it can change before we get to free this item */
        i = ds_unres->disabled_leafrefs.count - 1;
        l = ds_unres->disabled_leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_leafrefs, i, free);
    }

    /* for leafref, we need 2 rounds - first detects circular chain by storing the first referred type (which
     * can be also leafref, in case it is already resolved, go through the chain and check that it does not
     * point to the starting leafref type). The second round stores the first non-leafref type for later data validation.
     * Also do the same check for set of the disabled leafrefs, but without the second round. */
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);
    }
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];

        /* store pointer to the real type */
        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            for (typeiter = lref->realtype;
                    typeiter->basetype == LY_TYPE_LEAFREF;
                    typeiter = ((struct lysc_type_leafref *)typeiter)->realtype) {}

            lysc_type_free(&cctx.free_ctx, lref->realtype);
            lref->realtype = typeiter;
            ++lref->realtype->refcount;
        }

        /* if 'goto' will be used on the 'resolve_all' label, then the current leafref will not be processed again */
        processed_leafrefs++;
    }

    /* check when, the referenced modules must be implemented now */
    while (ds_unres->whens.count) {
        i = ds_unres->whens.count - 1;
        w = ds_unres->whens.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, w->node->module->parsed, NULL);

        LOG_LOCSET(w->node, NULL);
        ret = lys_compile_unres_when(&cctx, w->when, w->node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        free(w);
        ly_set_rm_index(&ds_unres->whens, i, NULL);
    }

    /* check must */
    while (ds_unres->musts.count) {
        i = ds_unres->musts.count - 1;
        m = ds_unres->musts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, m->node->module->parsed, m->ext);

        LOG_LOCSET(m->node, NULL);
        ret = lys_compile_unres_must(&cctx, m->node, m->local_mods);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_must_free(m);
        ly_set_rm_index(&ds_unres->musts, i, NULL);
    }

    /* remove disabled enums/bits */
    while (ds_unres->disabled_bitenums.count) {
        i = ds_unres->disabled_bitenums.count - 1;
        node = ds_unres->disabled_bitenums.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        LOG_LOCSET(node, NULL);
        ret = lys_compile_unres_disabled_bitenum(&cctx, (struct lysc_node_leaf *)node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_bitenums, i, NULL);
    }

    /* finish incomplete default values compilation */
    while (ds_unres->dflts.count) {
        i = ds_unres->dflts.count - 1;
        d = ds_unres->dflts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, d->leaf->module->parsed, NULL);

        LOG_LOCSET(&d->leaf->node, NULL);
        if (d->leaf->nodetype == LYS_LEAF) {
            ret = lys_compile_unres_leaf_dlft(&cctx, d->leaf, d->dflt, unres);
        } else {
            ret = lys_compile_unres_llist_dflts(&cctx, d->llist, d->dflt, d->dflts, unres);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_dflt_free(ctx, d);
        ly_set_rm_index(&ds_unres->dflts, i, NULL);
    }

    /* some unres items may have been added by the default values */
    if ((processed_leafrefs != ds_unres->leafrefs.count) || ds_unres->disabled_leafrefs.count ||
            ds_unres->whens.count || ds_unres->musts.count || ds_unres->dflts.count) {
        goto resolve_all;
    }

    /* finally, remove all disabled nodes */
    for (i = 0; i < ds_unres->disabled.count; ++i) {
        node = ds_unres->disabled.snodes[i];
        ret = lys_compile_unres_check_disabled(node);
        LY_CHECK_GOTO(ret, cleanup);

        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        lysc_node_free(&cctx.free_ctx, node, 1);
    }

    /* also check if the leafref target has not been disabled */
    for (i = 0; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            ret = ly_path_compile_leafref(cctx.ctx, l->node, cctx.ext, lref->path,
                    (l->node->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY,
                    LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &path);
            ly_path_free(path);

            assert(ret != LY_ERECOMPILE);
            if (ret) {
                LOG_LOCSET(l->node, NULL);
                LOGVAL(ctx, LYVE_REFERENCE, "Target of leafref \"%s\" cannot be referenced because it is disabled.",
                        l->node->name);
                LOG_LOCBACK(1, 0);
                ret = LY_EVALID;
                goto cleanup;
            }
        }
    }

cleanup:
    assert(!cctx.free_ctx.ext_set.count);
    return ret;
}